

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReliablePdu.cpp
# Opt level: O2

void __thiscall DIS::DataReliablePdu::~DataReliablePdu(DataReliablePdu *this)

{
  ~DataReliablePdu(this);
  operator_delete(this);
  return;
}

Assistant:

DataReliablePdu::~DataReliablePdu()
{
    _fixedDatumRecords.clear();
    _variableDatumRecords.clear();
}